

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

float __thiscall wasm::Random::getFloat(Random *this)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_30;
  undefined8 local_20;
  float local_14;
  
  local_30.i32 = get32(this);
  local_20 = 2;
  local_14 = Literal::reinterpretf32((Literal *)&local_30.func);
  wasm::Literal::~Literal((Literal *)&local_30.func);
  return local_14;
}

Assistant:

float Random::getFloat() { return Literal(get32()).reinterpretf32(); }